

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O3

ostream * __thiscall
lf::refinement::MeshHierarchy::PrintInfo(MeshHierarchy *this,ostream *o,uint ctrl)

{
  Mesh *mesh;
  int iVar1;
  ostream *poVar2;
  ulong uVar3;
  char local_40;
  undefined7 uStack_3f;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"MeshHierarchy, ",0xf);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," levels: ",9);
  local_40 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&stack0xffffffffffffffc0,1);
  if ((int)((ulong)((long)(this->meshes_).
                          super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->meshes_).
                         super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) != 0) {
    uVar3 = 0;
    do {
      getMesh((MeshHierarchy *)&stack0xffffffffffffffc0,(size_type)this);
      mesh = (Mesh *)CONCAT71(uStack_3f,local_40);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      std::__ostream_insert<char,std::char_traits<char>>(o,"l=",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)o);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
      if (ctrl == 0) {
        iVar1 = (**mesh->_vptr_Mesh)(mesh);
        poVar2 = (ostream *)std::ostream::operator<<(o,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"D -> ",5);
        iVar1 = (*mesh->_vptr_Mesh[1])(mesh);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"D, ",3);
        (*mesh->_vptr_Mesh[3])(mesh,0);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," cells [",8);
        (*mesh->_vptr_Mesh[4])(mesh,3);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," tria, ",7);
        (*mesh->_vptr_Mesh[4])(mesh,4);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," quad], ",8);
        (*mesh->_vptr_Mesh[3])(mesh,1);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," edges, ",8);
        (*mesh->_vptr_Mesh[3])(mesh,2);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," nodes",6);
        local_40 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&stack0xffffffffffffffc0,1);
      }
      else {
        lf::mesh::utils::PrintInfo(o,mesh,0xb);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < ((ulong)((long)(this->meshes_).
                                    super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->meshes_).
                                   super__Vector_base<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff));
  }
  return o;
}

Assistant:

std::ostream &MeshHierarchy::PrintInfo(std::ostream &o, unsigned ctrl) const {
  o << "MeshHierarchy, " << NumLevels() << " levels: " << '\n';
  for (unsigned level = 0; level < NumLevels(); ++level) {
    const lf::mesh::Mesh &mesh{*getMesh(level)};
    o << "l=" << level << ": ";
    if (ctrl != 0) {
      lf::mesh::utils::PrintInfo(o, mesh);
    } else {
      o << static_cast<int>(mesh.DimMesh()) << "D -> "
        << static_cast<int>(mesh.DimWorld()) << "D, " << mesh.NumEntities(0)
        << " cells [" << mesh.NumEntities(lf::base::RefEl::kTria()) << " tria, "
        << mesh.NumEntities(lf::base::RefEl::kQuad()) << " quad], "
        << mesh.NumEntities(1) << " edges, " << mesh.NumEntities(2) << " nodes"
        << '\n';
    }
  }
  return o;
}